

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiBroker.cpp
# Opt level: O1

void __thiscall helics::MultiBroker::~MultiBroker(MultiBroker *this)

{
  pointer *this_00;
  
  this_00 = &this[-1].routingTable.
             super__Vector_base<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ~MultiBroker((MultiBroker *)this_00);
  operator_delete(this_00,0xfc8);
  return;
}

Assistant:

MultiBroker::~MultiBroker()
{
    BrokerBase::haltOperations = true;
    int exp = 2;
    while (!disconnectionStage.compare_exchange_weak(exp, 3)) {
        if (exp == 0) {
            MultiBroker::brokerDisconnect();
            exp = 1;
        } else {
            std::this_thread::sleep_for(std::chrono::milliseconds(50));
        }
    }
    masterComm.reset();  // need to ensure the comms are deleted before the callbacks become invalid
    BrokerBase::joinAllThreads();
}